

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_OES_framebuffer_object(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_OES_framebuffer_object != 0) {
    glad_glIsRenderbufferOES = (PFNGLISRENDERBUFFEROESPROC)(*load)("glIsRenderbufferOES");
    glad_glBindRenderbufferOES = (PFNGLBINDRENDERBUFFEROESPROC)(*load)("glBindRenderbufferOES");
    glad_glDeleteRenderbuffersOES =
         (PFNGLDELETERENDERBUFFERSOESPROC)(*load)("glDeleteRenderbuffersOES");
    glad_glGenRenderbuffersOES = (PFNGLGENRENDERBUFFERSOESPROC)(*load)("glGenRenderbuffersOES");
    glad_glRenderbufferStorageOES =
         (PFNGLRENDERBUFFERSTORAGEOESPROC)(*load)("glRenderbufferStorageOES");
    glad_glGetRenderbufferParameterivOES =
         (PFNGLGETRENDERBUFFERPARAMETERIVOESPROC)(*load)("glGetRenderbufferParameterivOES");
    glad_glIsFramebufferOES = (PFNGLISFRAMEBUFFEROESPROC)(*load)("glIsFramebufferOES");
    glad_glBindFramebufferOES = (PFNGLBINDFRAMEBUFFEROESPROC)(*load)("glBindFramebufferOES");
    glad_glDeleteFramebuffersOES =
         (PFNGLDELETEFRAMEBUFFERSOESPROC)(*load)("glDeleteFramebuffersOES");
    glad_glGenFramebuffersOES = (PFNGLGENFRAMEBUFFERSOESPROC)(*load)("glGenFramebuffersOES");
    glad_glCheckFramebufferStatusOES =
         (PFNGLCHECKFRAMEBUFFERSTATUSOESPROC)(*load)("glCheckFramebufferStatusOES");
    glad_glFramebufferRenderbufferOES =
         (PFNGLFRAMEBUFFERRENDERBUFFEROESPROC)(*load)("glFramebufferRenderbufferOES");
    glad_glFramebufferTexture2DOES =
         (PFNGLFRAMEBUFFERTEXTURE2DOESPROC)(*load)("glFramebufferTexture2DOES");
    glad_glGetFramebufferAttachmentParameterivOES =
         (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVOESPROC)
         (*load)("glGetFramebufferAttachmentParameterivOES");
    glad_glGenerateMipmapOES = (PFNGLGENERATEMIPMAPOESPROC)(*load)("glGenerateMipmapOES");
  }
  return;
}

Assistant:

static void load_GL_OES_framebuffer_object(GLADloadproc load) {
	if(!GLAD_GL_OES_framebuffer_object) return;
	glad_glIsRenderbufferOES = (PFNGLISRENDERBUFFEROESPROC)load("glIsRenderbufferOES");
	glad_glBindRenderbufferOES = (PFNGLBINDRENDERBUFFEROESPROC)load("glBindRenderbufferOES");
	glad_glDeleteRenderbuffersOES = (PFNGLDELETERENDERBUFFERSOESPROC)load("glDeleteRenderbuffersOES");
	glad_glGenRenderbuffersOES = (PFNGLGENRENDERBUFFERSOESPROC)load("glGenRenderbuffersOES");
	glad_glRenderbufferStorageOES = (PFNGLRENDERBUFFERSTORAGEOESPROC)load("glRenderbufferStorageOES");
	glad_glGetRenderbufferParameterivOES = (PFNGLGETRENDERBUFFERPARAMETERIVOESPROC)load("glGetRenderbufferParameterivOES");
	glad_glIsFramebufferOES = (PFNGLISFRAMEBUFFEROESPROC)load("glIsFramebufferOES");
	glad_glBindFramebufferOES = (PFNGLBINDFRAMEBUFFEROESPROC)load("glBindFramebufferOES");
	glad_glDeleteFramebuffersOES = (PFNGLDELETEFRAMEBUFFERSOESPROC)load("glDeleteFramebuffersOES");
	glad_glGenFramebuffersOES = (PFNGLGENFRAMEBUFFERSOESPROC)load("glGenFramebuffersOES");
	glad_glCheckFramebufferStatusOES = (PFNGLCHECKFRAMEBUFFERSTATUSOESPROC)load("glCheckFramebufferStatusOES");
	glad_glFramebufferRenderbufferOES = (PFNGLFRAMEBUFFERRENDERBUFFEROESPROC)load("glFramebufferRenderbufferOES");
	glad_glFramebufferTexture2DOES = (PFNGLFRAMEBUFFERTEXTURE2DOESPROC)load("glFramebufferTexture2DOES");
	glad_glGetFramebufferAttachmentParameterivOES = (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVOESPROC)load("glGetFramebufferAttachmentParameterivOES");
	glad_glGenerateMipmapOES = (PFNGLGENERATEMIPMAPOESPROC)load("glGenerateMipmapOES");
}